

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O2

VOID PAL_Reenter(PAL_Boundary boundary)

{
  CPalThread *this;
  PAL_Boundary in_ESI;
  
  if (PAL_InitializeChakraCoreCalled) {
    this = CorUnix::InternalGetCurrentThread();
    if (this == (CPalThread *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_Reenter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,0xa9);
      in_ESI = 0x16785f;
      fprintf(_stderr,"PAL_Reenter called on a thread unknown to this PAL\n");
    }
    CorUnix::CPalThread::Enter(this,in_ESI);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

VOID
PALAPI
PAL_Reenter(PAL_Boundary boundary)
{
    ENTRY_EXTERNAL("PAL_Reenter(boundary=%u)\n", boundary);

    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread == NULL)
    {
        ASSERT("PAL_Reenter called on a thread unknown to this PAL\n");
    }

    // We ignore the return code.  This call should only fail on internal
    // error, and we assert at the actual failure.
    pThread->Enter(boundary);

    LOGEXIT("PAL_Reenter returns\n");
}